

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_entry.cc
# Opt level: O0

int raptor_list_remove_entry(list_entry *item)

{
  list_entry *plVar1;
  list_entry *plVar2;
  bool bVar3;
  list_entry *next;
  list_entry *prior;
  list_entry *item_local;
  
  bVar3 = item->next != item;
  if (bVar3) {
    plVar1 = item->prev;
    plVar2 = item->next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
  }
  item_local._4_4_ = (uint)bVar3;
  return item_local._4_4_;
}

Assistant:

int raptor_list_remove_entry(list_entry* item) {
    if (item->next == item) {  // item is list head, it's empty.
        return 0;
    }

    list_entry* prior = item->prev;
    list_entry* next = item->next;

    prior->next = next;
    next->prev = prior;
    return 1;
}